

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QToolBarAreaLayoutItem> * __thiscall
QList<QToolBarAreaLayoutItem>::mid(QList<QToolBarAreaLayoutItem> *this,qsizetype pos,qsizetype len)

{
  CutResult CVar1;
  QArrayDataPointer<QToolBarAreaLayoutItem> *other;
  const_pointer pQVar2;
  long in_RDX;
  long in_RSI;
  QToolBarAreaLayoutItem *in_RDI;
  long in_FS_OFFSET;
  DataPointer copied;
  qsizetype l;
  qsizetype p;
  QList<QToolBarAreaLayoutItem> *in_stack_ffffffffffffff68;
  QList<QToolBarAreaLayoutItem> *in_stack_ffffffffffffff70;
  QToolBarAreaLayoutItem *this_00;
  undefined4 in_stack_ffffffffffffff90;
  QArrayDataPointer<QToolBarAreaLayoutItem> local_30;
  qsizetype local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_10 = in_RDX;
  CVar1 = QtPrivate::QContainerImplHelper::mid(*(qsizetype *)(in_RSI + 0x10),&local_10,&local_18);
  if (CVar1 < Full) {
    memset(in_RDI,0,0x18);
    QList((QList<QToolBarAreaLayoutItem> *)0x6f6c08);
  }
  else if (CVar1 == Full) {
    QList(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    local_30.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.ptr = (QToolBarAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_30.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QToolBarAreaLayoutItem>::QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutItem> *)
               CONCAT44(CVar1,in_stack_ffffffffffffff90),in_RSI,(qsizetype)this_00,
               (AllocationOption)((ulong)in_RDI >> 0x20));
    other = (QArrayDataPointer<QToolBarAreaLayoutItem> *)
            QArrayDataPointer<QToolBarAreaLayoutItem>::operator->(&local_30);
    pQVar2 = data((QList<QToolBarAreaLayoutItem> *)0x6f6c7a);
    pQVar2 = pQVar2 + local_10;
    data((QList<QToolBarAreaLayoutItem> *)0x6f6c95);
    QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::copyAppend
              ((QPodArrayOps<QToolBarAreaLayoutItem> *)this_00,in_RDI,pQVar2);
    QArrayDataPointer<QToolBarAreaLayoutItem>::QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutItem> *)pQVar2,other);
    QList((QList<QToolBarAreaLayoutItem> *)pQVar2,other);
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutItem> *)pQVar2);
    QArrayDataPointer<QToolBarAreaLayoutItem>::~QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutItem> *)pQVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QToolBarAreaLayoutItem> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> QList<T>::mid(qsizetype pos, qsizetype len) const
{
    qsizetype p = pos;
    qsizetype l = len;
    using namespace QtPrivate;
    switch (QContainerImplHelper::mid(d.size, &p, &l)) {
    case QContainerImplHelper::Null:
    case QContainerImplHelper::Empty:
        return QList();
    case QContainerImplHelper::Full:
        return *this;
    case QContainerImplHelper::Subset:
        break;
    }

    // Allocate memory
    DataPointer copied(l);
    copied->copyAppend(data() + p, data() + p + l);
    return copied;
}